

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  ChStreamOutAscii *pCVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ostream *poVar3;
  string asciifile;
  string out_dir;
  ChArchiveAsciiDump marchiveout;
  ChStreamOutAsciiFile mfileo;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avStack_102e8 [29];
  ChStreamOutAscii aCStack_10020 [65552];
  
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar2 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<
                     (pCVar2,"Copyright (c) 2017 projectchrono.org\nChrono version: ");
  pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,"7.0.0");
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\n\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar2,"CHRONO foundation classes demo: archives (serialization)\n\n");
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          chrono::GetChronoOutputPath_abi_cxx11_();
  std::operator+(&out_dir,__lhs,"DEMO_ARCHIVE");
  filesystem::path::path((path *)&mfileo,&out_dir);
  bVar1 = filesystem::create_directory((path *)&mfileo);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_102e8);
  if (!bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Error creating directory ");
    poVar3 = std::operator<<(poVar3,(string *)&out_dir);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    std::operator+(&asciifile,&out_dir,"/foo_archive.txt");
    chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile(&mfileo,asciifile._M_dataplus._M_p,_S_trunc);
    chrono::ChArchiveAsciiDump::ChArchiveAsciiDump(&marchiveout,aCStack_10020);
    my_serialization_example(&marchiveout.super_ChArchiveOut);
    chrono::ChArchiveOut::~ChArchiveOut(&marchiveout.super_ChArchiveOut);
    chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&mfileo);
    std::__cxx11::string::~string((string *)&asciifile);
    std::operator+(&asciifile,&out_dir,"/foo_archive.dat");
    chrono::ChStreamOutBinaryFile::ChStreamOutBinaryFile
              ((ChStreamOutBinaryFile *)&mfileo,asciifile._M_dataplus._M_p,_S_trunc);
    chrono::ChArchiveOutBinary::ChArchiveOutBinary
              ((ChArchiveOutBinary *)&marchiveout,(ChStreamOutBinary *)aCStack_10020);
    my_serialization_example(&marchiveout.super_ChArchiveOut);
    chrono::ChArchiveOut::~ChArchiveOut(&marchiveout.super_ChArchiveOut);
    chrono::ChStreamOutBinaryFile::~ChStreamOutBinaryFile((ChStreamOutBinaryFile *)&mfileo);
    std::__cxx11::string::~string((string *)&asciifile);
    std::operator+(&asciifile,&out_dir,"/foo_archive.dat");
    chrono::ChStreamInBinaryFile::ChStreamInBinaryFile
              ((ChStreamInBinaryFile *)&mfileo,asciifile._M_dataplus._M_p);
    chrono::ChArchiveInBinary::ChArchiveInBinary
              ((ChArchiveInBinary *)&marchiveout,(ChStreamInBinary *)aCStack_10020);
    my_deserialization_example((ChArchiveIn *)&marchiveout);
    chrono::ChArchiveIn::~ChArchiveIn((ChArchiveIn *)&marchiveout);
    chrono::ChStreamInBinaryFile::~ChStreamInBinaryFile((ChStreamInBinaryFile *)&mfileo);
    std::__cxx11::string::~string((string *)&asciifile);
    std::operator+(&asciifile,&out_dir,"/foo_archive.json");
    chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile(&mfileo,asciifile._M_dataplus._M_p,_S_trunc);
    chrono::ChArchiveOutJSON::ChArchiveOutJSON((ChArchiveOutJSON *)&marchiveout,&mfileo);
    my_serialization_example(&marchiveout.super_ChArchiveOut);
    chrono::ChArchiveOutJSON::~ChArchiveOutJSON((ChArchiveOutJSON *)&marchiveout);
    chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&mfileo);
    std::__cxx11::string::~string((string *)&asciifile);
    std::operator+(&asciifile,&out_dir,"/foo_archive.json");
    chrono::ChStreamInAsciiFile::ChStreamInAsciiFile
              ((ChStreamInAsciiFile *)&mfileo,asciifile._M_dataplus._M_p);
    chrono::ChArchiveInJSON::ChArchiveInJSON
              ((ChArchiveInJSON *)&marchiveout,(ChStreamInAsciiFile *)&mfileo);
    my_deserialization_example((ChArchiveIn *)&marchiveout);
    chrono::ChArchiveInJSON::~ChArchiveInJSON((ChArchiveInJSON *)&marchiveout);
    chrono::ChStreamInAsciiFile::~ChStreamInAsciiFile((ChStreamInAsciiFile *)&mfileo);
    std::__cxx11::string::~string((string *)&asciifile);
    std::operator+(&asciifile,&out_dir,"/foo_archive.xml");
    chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile(&mfileo,asciifile._M_dataplus._M_p,_S_trunc);
    chrono::ChArchiveOutXML::ChArchiveOutXML((ChArchiveOutXML *)&marchiveout,&mfileo);
    my_serialization_example(&marchiveout.super_ChArchiveOut);
    chrono::ChArchiveOutXML::~ChArchiveOutXML((ChArchiveOutXML *)&marchiveout);
    chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&mfileo);
    std::__cxx11::string::~string((string *)&asciifile);
    std::operator+(&asciifile,&out_dir,"/foo_archive.xml");
    chrono::ChStreamInAsciiFile::ChStreamInAsciiFile
              ((ChStreamInAsciiFile *)&marchiveout,asciifile._M_dataplus._M_p);
    chrono::ChArchiveInXML::ChArchiveInXML
              ((ChArchiveInXML *)&mfileo,(ChStreamInAsciiFile *)&marchiveout);
    my_deserialization_example((ChArchiveIn *)&mfileo);
    chrono::ChArchiveInXML::~ChArchiveInXML((ChArchiveInXML *)&mfileo);
    chrono::ChStreamInAsciiFile::~ChStreamInAsciiFile((ChStreamInAsciiFile *)&marchiveout);
    std::__cxx11::string::~string((string *)&asciifile);
    pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<(pCVar2,"Serialization test ended with success.\n\n");
    my_reflection_example();
    pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<(pCVar2,"Reflection test ended with success.\n");
  }
  std::__cxx11::string::~string((string *)&out_dir);
  return (uint)!bVar1;
}

Assistant:

int main(int argc, char* argv[]) {
    GetLog() << "Copyright (c) 2017 projectchrono.org\nChrono version: " << CHRONO_VERSION << "\n\n";

    GetLog() << "CHRONO foundation classes demo: archives (serialization)\n\n";

    // Create (if needed) output directory
    const std::string out_dir = GetChronoOutputPath() + "DEMO_ARCHIVE";
    if (!filesystem::create_directory(filesystem::path(out_dir))) {
        std::cout << "Error creating directory " << out_dir << std::endl;
        return 1;
    }

    //  Archives inherited from the base class ChArchiveOut can be
    // used to serialize objects, and streams inherited from ChArchiveIn
    // can be used to get them back. For example, file streams like
    // ChArchiveOutBinary and ChArchiveInBinary can be used for this
    // purpose.
    
    try {       
        
		
        {
            //
            // Example: SERIALIZE TO ASCII DUMP (useful for debugging etc.):
            //

            std::string asciifile = out_dir + "/foo_archive.txt";
            ChStreamOutAsciiFile mfileo(asciifile.c_str());

            // Create an ASCII archive object, for dumping C++ objects into a readable file
            ChArchiveAsciiDump marchiveout(mfileo);
        
            my_serialization_example(marchiveout);
        }


        {
            //
            // Example: SERIALIZE TO/FROM BINARY:
            //

            {
                std::string binfile = out_dir + "/foo_archive.dat";
                ChStreamOutBinaryFile mfileo(binfile.c_str());
                
				// Use a binary archive object to serialize C++ objects into the binary file
                ChArchiveOutBinary marchiveout(mfileo);

                my_serialization_example(marchiveout);
            }

            {
                std::string binfile = out_dir + "/foo_archive.dat";
                ChStreamInBinaryFile mfilei(binfile.c_str());
                
				// Use a binary archive object to deserialize C++ objects from the binary file
                ChArchiveInBinary marchivein(mfilei);

                my_deserialization_example(marchivein);
            }
        }


        {
            //
            // Example: SERIALIZE TO/FROM JSON:
            //

            {
                std::string jsonfile = out_dir + "/foo_archive.json";
                ChStreamOutAsciiFile mfileo(jsonfile.c_str());

                // Use a JSON archive object to serialize C++ objects into the file
                ChArchiveOutJSON marchiveout(mfileo);
        
                my_serialization_example(marchiveout);
            }

            
            {
                std::string jsonfile = out_dir + "/foo_archive.json";
                ChStreamInAsciiFile mfilei(jsonfile.c_str());

				// Use a JSON archive object to deserialize C++ objects from the file
                ChArchiveInJSON marchivein(mfilei);

                my_deserialization_example(marchivein);
            }
            
        }


		{
			//
			// Example: SERIALIZE TO/FROM XML
			//
			{
				std::string xmlfile = out_dir + "/foo_archive.xml";
				ChStreamOutAsciiFile mfileo(xmlfile.c_str());

				// Use a XML archive object to serialize C++ objects into the file
				ChArchiveOutXML marchiveout(mfileo);

				my_serialization_example(marchiveout);
			}

			{
				std::string xmlfile = out_dir + "/foo_archive.xml";
				ChStreamInAsciiFile mfilei(xmlfile.c_str());

				// Use a XML archive object to deserialize C++ objects from the file
				ChArchiveInXML marchivein(mfilei);

				my_deserialization_example(marchivein);
			}

		}


        GetLog() << "Serialization test ended with success.\n\n";


        my_reflection_example();

        GetLog() << "Reflection test ended with success.\n";


		

    } catch (const ChException &myex) {
        GetLog() << "ERROR: " << myex.what() << "\n\n";
    }


    return 0;
}